

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_copy(_glist *x)

{
  _binbuf *p_Var1;
  uint local_1c;
  char *pcStack_18;
  int bufsize;
  char *buf;
  _glist *x_local;
  
  if (x->gl_editor != (t_editor *)0x0) {
    buf = (char *)x;
    if (x->gl_editor->e_selection != (t_selection *)0x0) {
      binbuf_free(*(_binbuf **)(pd_maininstance.pd_gui)->i_editor);
      p_Var1 = canvas_docopy((_glist *)buf);
      *(_binbuf **)(pd_maininstance.pd_gui)->i_editor = p_Var1;
    }
    if (*(long *)(*(long *)(buf + 0xc0) + 0x28) != 0) {
      rtext_getseltext(*(_rtext **)(*(long *)(buf + 0xc0) + 0x28),&stack0xffffffffffffffe8,
                       (int *)&local_1c);
      pdgui_vmess("clipboard","r","clear");
      pdgui_vmess("clipboard","rp","append",(ulong)local_1c,pcStack_18);
    }
  }
  return;
}

Assistant:

static void canvas_copy(t_canvas *x)
{
    if (!x->gl_editor)
        return;
    if (x->gl_editor->e_selection)
    {
        binbuf_free(EDITOR->copy_binbuf);
        EDITOR->copy_binbuf = canvas_docopy(x);
    }
    if (x->gl_editor->e_textedfor)
    {
        char *buf;
        int bufsize;
        rtext_getseltext(x->gl_editor->e_textedfor, &buf, &bufsize);
        pdgui_vmess("clipboard", "r", "clear");
        pdgui_vmess("clipboard", "rp",  "append", bufsize, buf);
    }
}